

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<capnp::compiler::LexedTokens::Builder&>
          (String *__return_storage_ptr__,kj *this,Builder *params)

{
  kj *this_00;
  Builder *value;
  StringTree local_50;
  kj *local_18;
  Builder *params_local;
  
  local_18 = this;
  params_local = (Builder *)__return_storage_ptr__;
  this_00 = (kj *)fwd<capnp::compiler::LexedTokens::Builder&>((Builder *)this);
  toCharSequence<capnp::compiler::LexedTokens::Builder&>(&local_50,this_00,value);
  _::concat<kj::StringTree>(__return_storage_ptr__,&local_50);
  StringTree::~StringTree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}